

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O2

Abc_Ntk_t * Abc_FlowRetime_NtkSilentRestrash(Abc_Ntk_t *pNtk,int fCleanup)

{
  uint uVar1;
  int *piVar2;
  void **ppvVar3;
  Abc_Ntk_t *pNtkNew;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Ntk_t *pAVar6;
  int iVar7;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    pNtkNew = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
    for (iVar7 = 0; iVar7 < pNtk->vObjs->nSize; iVar7 = iVar7 + 1) {
      pAVar4 = Abc_NtkObj(pNtk,iVar7);
      if ((pAVar4 != (Abc_Obj_t *)0x0) && (uVar1 = *(uint *)&pAVar4->field_0x14, (uVar1 & 0xf) == 7)
         ) {
        piVar2 = (pAVar4->vFanins).pArray;
        ppvVar3 = pAVar4->pNtk->vObjs->pArray;
        pAVar5 = Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc,
                            (Abc_Obj_t *)
                            ((ulong)(uVar1 >> 10 & 1) ^ *(ulong *)((long)ppvVar3[*piVar2] + 0x40)),
                            (Abc_Obj_t *)
                            ((ulong)(uVar1 >> 0xb & 1) ^ *(ulong *)((long)ppvVar3[piVar2[1]] + 0x40)
                            ));
        (pAVar4->field_6).pCopy = pAVar5;
      }
    }
    Abc_NtkFinalize(pNtk,pNtkNew);
    if (fCleanup != 0) {
      Abc_AigCleanup((Abc_Aig_t *)pNtkNew->pManFunc);
    }
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
      pAVar6 = Abc_NtkDup(pNtk->pExdc);
      pNtkNew->pExdc = pAVar6;
    }
    iVar7 = Abc_NtkCheck(pNtkNew);
    if (iVar7 == 0) {
      puts("Abc_NtkStrash: The network check has failed.");
      Abc_NtkDelete(pNtkNew);
      pNtkNew = (Abc_Ntk_t *)0x0;
    }
    return pNtkNew;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretMain.c"
                ,0x4a5,"Abc_Ntk_t *Abc_FlowRetime_NtkSilentRestrash(Abc_Ntk_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_FlowRetime_NtkSilentRestrash( Abc_Ntk_t * pNtk, int fCleanup )
{
    Abc_Ntk_t * pNtkAig;
    Abc_Obj_t * pObj;
    int i, nNodes;//, RetValue;
    assert( Abc_NtkIsStrash(pNtk) );
    // start the new network (constants and CIs of the old network will point to the their counterparts in the new network)
    pNtkAig = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );
    // restrash the nodes (assuming a topological order of the old network)
    Abc_NtkForEachNode( pNtk, pObj, i )
        pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkAig->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
    // finalize the network
    Abc_NtkFinalize( pNtk, pNtkAig );
    // perform cleanup if requested
    if ( fCleanup )
      nNodes = Abc_AigCleanup((Abc_Aig_t *)pNtkAig->pManFunc);
    // duplicate EXDC 
    if ( pNtk->pExdc )
      pNtkAig->pExdc = Abc_NtkDup( pNtk->pExdc );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkAig ) )
      {
        printf( "Abc_NtkStrash: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
      }
    return pNtkAig;
}